

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_select(jit_State *J,RecordFFData *rd)

{
  uint uVar1;
  int32_t iVar2;
  TRef TVar3;
  ulong uVar4;
  ulong uVar5;
  long in_RSI;
  TValue *in_RDI;
  TRef unaff_retaddr;
  ptrdiff_t i;
  ptrdiff_t n;
  ptrdiff_t start;
  TRef tr;
  jit_State *in_stack_ffffffffffffffc8;
  long local_30;
  undefined8 in_stack_ffffffffffffffd8;
  int32_t k;
  
  k = (int32_t)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  uVar1 = *(uint *)in_RDI[0x10];
  if (uVar1 != 0) {
    iVar2 = lj_ffrecord_select_mode((jit_State *)i,unaff_retaddr,in_RDI);
    uVar4 = (ulong)iVar2;
    if (uVar4 == 0) {
      TVar3 = lj_ir_kint((jit_State *)0x0,k);
      *(TRef *)in_RDI[0x10] = TVar3;
    }
    else {
      if (0x7fff < (uVar1 & 0xffff)) {
        recff_nyiu(in_stack_ffffffffffffffc8);
      }
      uVar5 = (ulong)*(uint *)((long)in_RDI + 0x8c);
      if ((long)uVar4 < 0) {
        uVar4 = uVar5 + uVar4;
      }
      else if ((long)uVar5 < (long)uVar4) {
        uVar4 = uVar5;
      }
      *(ulong *)(in_RSI + 8) = uVar5 - uVar4;
      if (0 < (long)uVar4) {
        for (local_30 = 0; local_30 < (long)(uVar5 - uVar4); local_30 = local_30 + 1) {
          *(undefined4 *)(in_RDI[0x10].u64 + local_30 * 4) =
               *(undefined4 *)(in_RDI[0x10].u64 + (uVar4 + local_30) * 4);
        }
      }
    }
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_select(jit_State *J, RecordFFData *rd)
{
  TRef tr = J->base[0];
  if (tr) {
    ptrdiff_t start = lj_ffrecord_select_mode(J, tr, &rd->argv[0]);
    if (start == 0) {  /* select('#', ...) */
      J->base[0] = lj_ir_kint(J, J->maxslot - 1);
    } else if (tref_isk(tr)) {  /* select(k, ...) */
      ptrdiff_t n = (ptrdiff_t)J->maxslot;
      if (start < 0) start += n;
      else if (start > n) start = n;
      rd->nres = n - start;
      if (start >= 1) {
	ptrdiff_t i;
	for (i = 0; i < n - start; i++)
	  J->base[i] = J->base[start+i];
      }  /* else: Interpreter will throw. */
    } else {
      recff_nyiu(J);
    }
  }  /* else: Interpreter will throw. */
}